

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O3

bool __thiscall
fasttext::FastText::predictLine
          (FastText *this,istream *in,
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *predictions)

{
  pointer ppVar1;
  int iVar2;
  pointer ppVar3;
  Predictions linePredictions;
  vector<int,_std::allocator<int>_> words;
  vector<int,_std::allocator<int>_> labels;
  float local_ac;
  Predictions local_a8;
  vector<int,_std::allocator<int>_> local_88;
  string local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(predictions);
  iVar2 = std::istream::peek();
  if (iVar2 != -1) {
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,&local_88,&local_48);
    local_a8.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    predict(this,&local_88,&local_a8);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve(predictions,
              (long)local_a8.
                    super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.
                    super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    ppVar1 = local_a8.
             super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (local_a8.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_a8.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ppVar3 = local_a8.
               super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        local_ac = expf(ppVar3->first);
        Dictionary::getLabel_abi_cxx11_
                  (&local_68,
                   (this->dict_).
                   super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   ppVar3->second);
        std::
        vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
        ::emplace_back<float,std::__cxx11::string>
                  ((vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
                    *)predictions,&local_ac,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        ppVar3 = ppVar3 + 1;
      } while (ppVar3 != ppVar1);
    }
    if (local_a8.super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return iVar2 != -1;
}

Assistant:

bool FastText::predictLine(std::istream& in, std::vector<std::pair<real, std::string>>& predictions) const {
  predictions.clear();
  if (in.peek() == EOF) {
    return false;
  }

  std::vector<int32_t> words, labels;
  dict_->getLine(in, words, labels);
  Predictions linePredictions;
  predict(words, linePredictions);
  predictions.reserve(linePredictions.size());
  for (const auto& p : linePredictions) {
    predictions.emplace_back(std::exp(p.first), dict_->getLabel(p.second));
  }

  return true;
}